

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
CreateRuntimeCore(JsRuntimeAttributes attributes,char *optTTUri,size_t optTTUriCount,bool isRecord,
                 bool isReplay,bool isDebug,UINT32 snapInterval,UINT32 snapHistoryLength,
                 TTDOpenResourceStreamCallback openResourceStream,
                 JsTTDReadBytesFromStreamCallback readBytesFromStream,
                 JsTTDWriteBytesToStreamCallback writeBytesToStream,
                 JsTTDFlushAndCloseStreamCallback flushAndCloseStream,
                 JsThreadServiceCallback threadService,JsRuntimeHandle *runtimeHandle)

{
  undefined8 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  HeapAllocator *pHVar5;
  AllocationPolicyManager *this;
  ThreadContext *pTVar6;
  Recycler *this_00;
  JsrtRuntime *this_01;
  JsErrorCode JVar7;
  JsrtRuntime *runtime;
  uint32 snapHistoryLength_00;
  undefined1 local_b0 [8];
  TrackAllocData data;
  AutoNestedHandledExceptionType local_68 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  VALIDATE_ENTER_CURRENT_THREAD();
  if (runtimeHandle == (JsRuntimeHandle *)0x0) {
    JVar7 = JsErrorNullArgument;
  }
  else {
    *runtimeHandle = (JsRuntimeHandle)0x0;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if ((attributes & 0xf7fffe00) == JsRuntimeAttributeNone) {
      CreateFileMappingW(&DAT_ffffffffffffffff,(LPSECURITY_ATTRIBUTES)0x0,4,0,0,(LPCWSTR)0x0);
      local_b0 = (undefined1  [8])&AllocationPolicyManager::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_18244a;
      data.filename._0_4_ = 0x138;
      pHVar5 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b0);
      this = (AllocationPolicyManager *)new<Memory::HeapAllocator>(0x68,pHVar5,0x2ff150);
      AllocationPolicyManager::AllocationPolicyManager
                (this,(attributes & JsRuntimeAttributeDisableBackgroundWork) ==
                      JsRuntimeAttributeNone);
      local_b0 = (undefined1  [8])&ThreadContext::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_18244a;
      data.filename._0_4_ = 0x13a;
      pHVar5 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b0);
      pTVar6 = (ThreadContext *)new<Memory::HeapAllocator>(0x1760,pHVar5,0x2ff150);
      ThreadContext::ThreadContext
                (pTVar6,this,(ThreadServiceCallback)threadService,
                 SUB41((attributes & JsRuntimeAttributeEnableExperimentalFeatures) >> 5,0));
      if (((attributes & JsRuntimeAttributeDisableBackgroundWork) != JsRuntimeAttributeNone) &&
         (DAT_015933ba == '\0')) {
        ThreadContext::OptimizeForManyInstances(pTVar6,true);
        ThreadContext::EnableBgJit(pTVar6,false);
      }
      if (DAT_015962f2 == '\x01') {
        if (pTVar6->recycler != (Recycler *)0x0) {
          Memory::Recycler::SetIsThreadBound(pTVar6->recycler);
        }
        pTVar6->isThreadBound = true;
      }
      if ((attributes & JsRuntimeAttributeAllowScriptInterrupt) != JsRuntimeAttributeNone) {
        ThreadContext::SetThreadContextFlag(pTVar6,ThreadContextFlagCanDisableExecution);
      }
      if ((attributes & JsRuntimeAttributeDisableEval) != JsRuntimeAttributeNone) {
        ThreadContext::SetThreadContextFlag(pTVar6,ThreadContextFlagEvalDisabled);
      }
      if ((attributes & JsRuntimeAttributeDisableNativeCodeGeneration) != JsRuntimeAttributeNone) {
        ThreadContext::SetThreadContextFlag(pTVar6,ThreadContextFlagNoJIT);
      }
      if ((attributes >> 8 & 1) != 0) {
        ThreadContext::SetThreadContextFlag(pTVar6,ThreadContextFlagNoJIT);
        ThreadContext::SetThreadContextFlag(pTVar6,ThreadContextFlagNoDynamicThunks);
      }
      if ((char)attributes < '\0') {
        ThreadContext::SetThreadContextFlag(pTVar6,ThreadContextFlagDisableFatalOnOOM);
      }
      if (DAT_015a4da4 == '\x01') {
        this_00 = ThreadContext::EnsureRecycler(pTVar6);
        Memory::Recycler::Prime(this_00);
      }
      local_b0 = (undefined1  [8])&JsrtRuntime::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_18244a;
      data.filename._0_4_ = 0x175;
      pHVar5 = Memory::HeapAllocator::TrackAllocInfo
                         (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b0);
      this_01 = (JsrtRuntime *)new<Memory::HeapAllocator>(0x70,pHVar5,0x2ff150);
      JsrtRuntime::JsrtRuntime
                (this_01,pTVar6,SUB41((attributes & JsRuntimeAttributeEnableIdleProcessing) >> 2,0),
                 SUB41((attributes & JsRuntimeAttributeDispatchSetExceptionsToDebugger) >> 6,0));
      pTVar6->currentThreadId = 0xffffffff;
      *runtimeHandle = this_01;
      this_01->serializeByteCodeForLibrary = SUB41(attributes >> 0x1b,0);
      JVar7 = JsNoError;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0x132,"((attributes & ~JsRuntimeAttributesAll) == 0)",
                         "(attributes & ~JsRuntimeAttributesAll) == 0");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      JVar7 = JsErrorInvalidArgument;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
    if ((JVar7 == JsNoError) && (JVar7 = JsNoError, (isRecord || isReplay) || isDebug)) {
      puVar1 = (undefined8 *)*runtimeHandle;
      ThreadContext::ValidateThreadContext((ThreadContext *)*puVar1);
      pTVar6 = (ThreadContext *)*puVar1;
      if (isRecord) {
        if (isReplay) {
          return JsErrorInvalidArgument;
        }
      }
      else if (isReplay && optTTUri == (char *)0x0) {
        return JsErrorInvalidArgument;
      }
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      ThreadContextScope::ThreadContextScope((ThreadContextScope *)&data.line,pTVar6);
      ThreadContext::EnsureRecycler(pTVar6);
      snapHistoryLength_00 = 2;
      if (2 < snapHistoryLength) {
        snapHistoryLength_00 = snapHistoryLength;
      }
      ThreadContext::InitTimeTravel(pTVar6,pTVar6,*runtimeHandle,snapInterval,snapHistoryLength_00);
      ThreadContext::InitHostFunctionsAndTTData
                (pTVar6,isRecord,isReplay,isDebug,optTTUriCount,optTTUri,openResourceStream,
                 readBytesFromStream,writeBytesToStream,flushAndCloseStream,
                 CreateExternalObject_TTDCallback,CreateJsRTContext_TTDCallback,
                 ReleaseJsRTContext_TTDCallback,SetActiveJsRTContext_TTDCallback);
      ThreadContextScope::~ThreadContextScope((ThreadContextScope *)&data.line);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
      JVar7 = JsNoError;
    }
  }
  return JVar7;
}

Assistant:

JsErrorCode CreateRuntimeCore(_In_ JsRuntimeAttributes attributes,
    _In_opt_ const char* optTTUri, size_t optTTUriCount, bool isRecord, bool isReplay, bool isDebug,
    _In_ UINT32 snapInterval, _In_ UINT32 snapHistoryLength,
    _In_opt_ TTDOpenResourceStreamCallback openResourceStream, _In_opt_ JsTTDReadBytesFromStreamCallback readBytesFromStream,
    _In_opt_ JsTTDWriteBytesToStreamCallback writeBytesToStream, _In_opt_ JsTTDFlushAndCloseStreamCallback flushAndCloseStream,
    _In_opt_ JsThreadServiceCallback threadService, _Out_ JsRuntimeHandle *runtimeHandle)
{
    VALIDATE_ENTER_CURRENT_THREAD();

    PARAM_NOT_NULL(runtimeHandle);
    *runtimeHandle = nullptr;

    JsErrorCode runtimeResult = GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        const JsRuntimeAttributes JsRuntimeAttributesAll =
            (JsRuntimeAttributes)(
            JsRuntimeAttributeDisableBackgroundWork |
            JsRuntimeAttributeAllowScriptInterrupt |
            JsRuntimeAttributeEnableIdleProcessing |
            JsRuntimeAttributeDisableEval |
            JsRuntimeAttributeDisableNativeCodeGeneration |
            JsRuntimeAttributeDisableExecutablePageAllocation |
            JsRuntimeAttributeEnableExperimentalFeatures |
            JsRuntimeAttributeDispatchSetExceptionsToDebugger |
            JsRuntimeAttributeDisableFatalOnOOM
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            | JsRuntimeAttributeSerializeLibraryByteCode
#endif
        );

        Assert((attributes & ~JsRuntimeAttributesAll) == 0);
        if ((attributes & ~JsRuntimeAttributesAll) != 0)
        {
            return JsErrorInvalidArgument;
        }
        CreateFileMapping(INVALID_HANDLE_VALUE, nullptr, PAGE_READWRITE, 0, 0, nullptr);
        AllocationPolicyManager * policyManager = HeapNew(AllocationPolicyManager, (attributes & JsRuntimeAttributeDisableBackgroundWork) == 0);
        bool enableExperimentalFeatures = (attributes & JsRuntimeAttributeEnableExperimentalFeatures) != 0;
        ThreadContext * threadContext = HeapNew(ThreadContext, policyManager, threadService, enableExperimentalFeatures);

        if (((attributes & JsRuntimeAttributeDisableBackgroundWork) != 0)
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            && !Js::Configuration::Global.flags.ConcurrentRuntime
#endif
            )
        {
            threadContext->OptimizeForManyInstances(true);
#if ENABLE_NATIVE_CODEGEN
            threadContext->EnableBgJit(false);
#endif
        }

        if (!threadContext->IsRentalThreadingEnabledInJSRT()
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            || Js::Configuration::Global.flags.DisableRentalThreading
#endif
            )
        {
            threadContext->SetIsThreadBound();
        }

        if (attributes & JsRuntimeAttributeAllowScriptInterrupt)
        {
            threadContext->SetThreadContextFlag(ThreadContextFlagCanDisableExecution);
        }

        if (attributes & JsRuntimeAttributeDisableEval)
        {
            threadContext->SetThreadContextFlag(ThreadContextFlagEvalDisabled);
        }

        if (attributes & JsRuntimeAttributeDisableNativeCodeGeneration)
        {
            threadContext->SetThreadContextFlag(ThreadContextFlagNoJIT);
        }

        if (attributes & JsRuntimeAttributeDisableExecutablePageAllocation)
        {
            threadContext->SetThreadContextFlag(ThreadContextFlagNoJIT);
            threadContext->SetThreadContextFlag(ThreadContextFlagNoDynamicThunks);
        }

        if (attributes & JsRuntimeAttributeDisableFatalOnOOM)
        {
            threadContext->SetThreadContextFlag(ThreadContextFlagDisableFatalOnOOM);
        }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.PrimeRecycler)
        {
            threadContext->EnsureRecycler()->Prime();
        }
#endif

        bool enableIdle = (attributes & JsRuntimeAttributeEnableIdleProcessing) == JsRuntimeAttributeEnableIdleProcessing;
        bool dispatchExceptions = (attributes & JsRuntimeAttributeDispatchSetExceptionsToDebugger) == JsRuntimeAttributeDispatchSetExceptionsToDebugger;

        JsrtRuntime * runtime = HeapNew(JsrtRuntime, threadContext, enableIdle, dispatchExceptions);
        threadContext->SetCurrentThreadId(ThreadContext::NoThread);
        *runtimeHandle = runtime->ToHandle();
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        runtime->SetSerializeByteCodeForLibrary((attributes & JsRuntimeAttributeSerializeLibraryByteCode) != 0);
#endif

        return JsNoError;
    });

#if ENABLE_TTD
    if(runtimeResult != JsNoError)
    {
        return runtimeResult;
    }

    if(isRecord | isReplay | isDebug)
    {
        ThreadContext* threadContext = JsrtRuntime::FromHandle(*runtimeHandle)->GetThreadContext();

        if(isRecord && isReplay)
        {
            return JsErrorInvalidArgument; //A runtime can only be in 1 mode
        }

        if(isReplay && optTTUri == nullptr)
        {
            return JsErrorInvalidArgument; //We must have a location to store data into
        }

        runtimeResult = GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
            //Make sure the thread context recycler is allocated before we do anything else
            ThreadContextScope scope(threadContext);
            threadContext->EnsureRecycler();

            threadContext->InitTimeTravel(threadContext, *runtimeHandle, snapInterval, max<uint32>(2, snapHistoryLength));
            threadContext->InitHostFunctionsAndTTData(isRecord, isReplay, isDebug, optTTUriCount, optTTUri,
                openResourceStream, readBytesFromStream, writeBytesToStream, flushAndCloseStream,
                &CreateExternalObject_TTDCallback, &CreateJsRTContext_TTDCallback, &ReleaseJsRTContext_TTDCallback, &SetActiveJsRTContext_TTDCallback);

            return JsNoError;
        });
    }
#endif

    return runtimeResult;
}